

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataParser::Pop(DataParser *this,Register destination)

{
  undefined1 local_40 [48];
  
  if (this->program_stack_size < 1) {
    local_40._0_8_ = local_40 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Internal parser error: Tried to pop an empty stack.","");
    Error(this,(String *)local_40);
    if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
    }
  }
  else {
    this->program_stack_size = this->program_stack_size + -1;
    local_40._0_4_ = Pop;
    local_40._8_8_ = NONE;
    Variant::Set((Variant *)(local_40 + 8),destination);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,(InstructionData *)local_40);
    Variant::~Variant((Variant *)(local_40 + 8));
  }
  return;
}

Assistant:

void Pop(Register destination)
	{
		if (program_stack_size <= 0)
		{
			Error("Internal parser error: Tried to pop an empty stack.");
			return;
		}
		program_stack_size -= 1;
		program.push_back(InstructionData{Instruction::Pop, Variant(int(destination))});
	}